

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::parseQualOption(OptionParser *this,string *s2,string *s3,Network *network)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  InputError *pIVar4;
  string local_118 [32];
  Utilities local_f8 [8];
  string s3U;
  string local_d0 [32];
  int local_b0;
  undefined1 local_a9;
  int nodeIndex;
  allocator local_81;
  string local_80 [52];
  int local_4c;
  Utilities local_48 [4];
  int i;
  string s2U;
  Network *network_local;
  string *s3_local;
  string *s2_local;
  OptionParser *this_local;
  
  Utilities::upperCase(local_48,s2);
  local_4c = Utilities::findFullMatch((string *)local_48,epanetQualKeywords);
  pcVar1 = w_CHEMICAL;
  if (local_4c < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar1,&local_81);
    Options::setOption(&network->options,QUAL_MODEL,(string *)local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    Options::setOption(&network->options,QUAL_NAME,s2);
    Options::setOption(&network->options,QUAL_TYPE,3);
    Options::setOption(&network->options,QUAL_UNITS,3);
  }
  else {
    Options::setOption(&network->options,QUAL_MODEL,(string *)local_48);
    Options::setOption(&network->options,QUAL_NAME,(string *)local_48);
    Options::setOption(&network->options,QUAL_TYPE,local_4c);
    Options::setOption(&network->options,QUAL_UNITS,local_4c);
  }
  iVar2 = Network::option(network,QUAL_TYPE);
  if (iVar2 == 2) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      local_a9 = 1;
      pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&nodeIndex,(string *)s3);
      InputError::InputError(pIVar4,5,(string *)&nodeIndex);
      local_a9 = 0;
      __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
    }
    local_b0 = Network::indexOf(network,NODE,s3);
    if (local_b0 < 0) {
      pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_d0,(string *)s3);
      InputError::InputError(pIVar4,5,(string *)local_d0);
      __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
    }
    Options::setOption(&network->options,TRACE_NODE,local_b0);
    Options::setOption(&network->options,TRACE_NODE_NAME,s3);
  }
  iVar2 = Network::option(network,QUAL_TYPE);
  if (iVar2 == 3) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      Utilities::upperCase(local_f8,s3);
      iVar2 = std::__cxx11::string::compare((char *)local_f8);
      if (iVar2 == 0) {
        Options::setOption(&network->options,QUAL_UNITS,3);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_f8);
        if (iVar2 != 0) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_118,(string *)s3);
          InputError::InputError(pIVar4,3,(string *)local_118);
          __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
        }
        Options::setOption(&network->options,QUAL_UNITS,4);
      }
      std::__cxx11::string::~string((string *)local_f8);
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void OptionParser::parseQualOption(const string& s2, const string& s3,
                                   Network* network)
{
    string s2U = Utilities::upperCase(s2);
    int i = Utilities::findFullMatch(s2U, epanetQualKeywords);
    if ( i >= 0 )
    {
        network->options.setOption(Options::QUAL_MODEL, s2U);
        network->options.setOption(Options::QUAL_NAME, s2U);
        network->options.setOption(Options::QUAL_TYPE, i);
        network->options.setOption(Options::QUAL_UNITS, i);
    }
    else
    {
        network->options.setOption(Options::QUAL_MODEL, w_CHEMICAL);
        network->options.setOption(Options::QUAL_NAME, s2);
        network->options.setOption(Options::QUAL_TYPE, Options::CHEM);
        network->options.setOption(Options::QUAL_UNITS, Options::MGL);
    }

    if (network->option(Options::QUAL_TYPE) == Options::TRACE)
    {
        if (s3.empty()) throw InputError(InputError::UNDEFINED_OBJECT, s3);
        int nodeIndex = network->indexOf(Element::NODE, s3);
        if (nodeIndex < 0) throw InputError(InputError::UNDEFINED_OBJECT, s3);
        network->options.setOption(Options::TRACE_NODE, nodeIndex);
        network->options.setOption(Options::TRACE_NODE_NAME, s3);
    }

    if (network->option(Options::QUAL_TYPE) == Options::CHEM && !s3.empty())
    {
        string s3U = Utilities::upperCase(s3);
        if (s3U.compare("MG/L") == 0)
            network->options.setOption(Options::QUAL_UNITS, Options::MGL);
        else if (s3U.compare("UG/L") == 0)
            network->options.setOption(Options::QUAL_UNITS, Options::UGL);
        else throw InputError(InputError::INVALID_KEYWORD, s3);
    }
}